

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_ls.c
# Opt level: O1

int KINSetLinearSolver(void *kinmem,SUNLinearSolver LS,SUNMatrix A)

{
  _generic_SUNLinearSolver_Ops *p_Var1;
  long lVar2;
  SUNLinearSolver_Type SVar3;
  int iVar4;
  undefined4 *__s;
  int error_code;
  char *pcVar5;
  
  if (kinmem == (void *)0x0) {
    pcVar5 = "KINSOL memory is NULL.";
    iVar4 = -1;
    kinmem = (KINMem)0x0;
    error_code = -1;
  }
  else {
    if (LS == (SUNLinearSolver)0x0) {
      pcVar5 = "LS must be non-NULL";
      kinmem = (KINMem)0x0;
    }
    else {
      p_Var1 = LS->ops;
      if ((((p_Var1->gettype == (_func_SUNLinearSolver_Type_SUNLinearSolver *)0x0) ||
           (p_Var1->initialize == (_func_int_SUNLinearSolver *)0x0)) ||
          (p_Var1->setup == (_func_int_SUNLinearSolver_SUNMatrix *)0x0)) ||
         (p_Var1->solve == (_func_int_SUNLinearSolver_SUNMatrix_N_Vector_N_Vector_realtype *)0x0)) {
        pcVar5 = "LS object is missing a required operation";
      }
      else {
        lVar2 = *(long *)(*(long *)((long)kinmem + 0x140) + 8);
        if ((*(long *)(lVar2 + 0x40) == 0) || (*(long *)(lVar2 + 0x78) == 0)) {
          pcVar5 = "A required vector operation is not implemented.";
        }
        else {
          SVar3 = SUNLinSolGetType(LS);
          if ((SVar3 == SUNLINEARSOLVER_ITERATIVE) &&
             (LS->ops->setatimes == (_func_int_SUNLinearSolver_void_ptr_ATimesFn *)0x0)) {
            pcVar5 = "Incompatible inputs: iterative LS must support ATimes routine";
          }
          else if (A == (SUNMatrix)0x0 && SVar3 == SUNLINEARSOLVER_DIRECT) {
            pcVar5 = "Incompatible inputs: direct LS requires non-NULL matrix";
          }
          else {
            if (SVar3 != SUNLINEARSOLVER_MATRIX_ITERATIVE || A != (SUNMatrix)0x0) {
              if (*(code **)((long)kinmem + 0x1e8) != (code *)0x0) {
                (**(code **)((long)kinmem + 0x1e8))(kinmem);
              }
              *(uint *)((long)kinmem + 0x1f0) = (uint)(SVar3 - SUNLINEARSOLVER_ITERATIVE < 2);
              *(code **)((long)kinmem + 0x1d0) = kinLsInitialize;
              *(code **)((long)kinmem + 0x1d8) = kinLsSetup;
              *(code **)((long)kinmem + 0x1e0) = kinLsSolve;
              *(code **)((long)kinmem + 0x1e8) = kinLsFree;
              __s = (undefined4 *)malloc(0xb0);
              if (__s != (undefined4 *)0x0) {
                memset(__s,0,0xb0);
                *(SUNLinearSolver *)(__s + 6) = LS;
                if (A == (SUNMatrix)0x0) {
                  *__s = 0;
                  *(undefined8 *)(__s + 2) = 0;
                  *(undefined8 *)(__s + 4) = 0;
                }
                else {
                  *__s = 1;
                  *(code **)(__s + 2) = kinLsDQJac;
                  *(void **)(__s + 4) = kinmem;
                }
                __s[0x26] = 1;
                *(code **)(__s + 0x28) = kinLsDQJtimes;
                *(void **)(__s + 0x2a) = kinmem;
                *(undefined8 *)(__s + 0x1e) = 0;
                *(undefined8 *)(__s + 0x20) = 0;
                *(undefined8 *)(__s + 0x22) = 0;
                *(undefined8 *)(__s + 0x24) = *(undefined8 *)((long)kinmem + 0x10);
                *(undefined8 *)(__s + 0xc) = 0;
                *(undefined8 *)(__s + 0xe) = 0;
                *(undefined8 *)(__s + 0x10) = 0;
                *(undefined8 *)(__s + 0x12) = 0;
                *(undefined8 *)(__s + 0x14) = 0;
                *(undefined8 *)(__s + 0x16) = 0;
                *(undefined8 *)(__s + 0x18) = 0;
                *(undefined8 *)(__s + 0x1c) = 0;
                if ((LS->ops->setatimes == (_func_int_SUNLinearSolver_void_ptr_ATimesFn *)0x0) ||
                   (iVar4 = SUNLinSolSetATimes(LS,kinmem,kinLsATimes), iVar4 == 0)) {
                  if ((LS->ops->setpreconditioner ==
                       (_func_int_SUNLinearSolver_void_ptr_PSetupFn_PSolveFn *)0x0) ||
                     (iVar4 = SUNLinSolSetPreconditioner(LS,kinmem,(PSetupFn)0x0,(PSolveFn)0x0),
                     iVar4 == 0)) {
                    *(undefined8 *)(__s + 10) = 0xbff0000000000000;
                    *(SUNMatrix *)(__s + 8) = A;
                    *(undefined4 **)((long)kinmem + 0x1f8) = __s;
                    return 0;
                  }
                  pcVar5 = "Error in calling SUNLinSolSetPreconditioner";
                }
                else {
                  pcVar5 = "Error in calling SUNLinSolSetATimes";
                }
                KINProcessError((KINMem)kinmem,-8,"KINLS","KINSetLinearSolver",pcVar5);
                free(__s);
                return -8;
              }
              pcVar5 = "A memory request failed.";
              iVar4 = -4;
              error_code = -4;
              goto LAB_0010e37e;
            }
            pcVar5 = "Incompatible inputs: matrix-iterative LS requires non-NULL matrix";
          }
        }
      }
    }
    iVar4 = -3;
    error_code = -3;
  }
LAB_0010e37e:
  KINProcessError((KINMem)kinmem,error_code,"KINLS","KINSetLinearSolver",pcVar5);
  return iVar4;
}

Assistant:

int KINSetLinearSolver(void *kinmem, SUNLinearSolver LS, SUNMatrix A)
{
  KINMem   kin_mem;
  KINLsMem kinls_mem;
  int      retval, LSType;

  /* Return immediately if either kinmem or LS inputs are NULL */
  if (kinmem == NULL) {
    KINProcessError(NULL, KINLS_MEM_NULL, "KINLS",
                    "KINSetLinearSolver", MSG_LS_KINMEM_NULL);
    return(KINLS_MEM_NULL);
  }
  if (LS == NULL) {
    KINProcessError(NULL, KINLS_ILL_INPUT, "KINLS",
                    "KINSetLinearSolver",
                    "LS must be non-NULL");
    return(KINLS_ILL_INPUT);
  }
  kin_mem = (KINMem) kinmem;

  /* Test if solver is compatible with LS interface */
  if ( (LS->ops->gettype == NULL) ||
       (LS->ops->initialize == NULL) ||
       (LS->ops->setup == NULL) ||
       (LS->ops->solve == NULL) ) {
    KINProcessError(kin_mem, KINLS_ILL_INPUT, "KINLS",
                   "KINSetLinearSolver",
                   "LS object is missing a required operation");
    return(KINLS_ILL_INPUT);
  }

  /* check for required vector operations for KINLS interface */
  if ( (kin_mem->kin_vtemp1->ops->nvconst == NULL) ||
       (kin_mem->kin_vtemp1->ops->nvdotprod == NULL) ) {
    KINProcessError(kin_mem, KINLS_ILL_INPUT, "KINLS",
                    "KINSetLinearSolver", MSG_LS_BAD_NVECTOR);
    return(KINLS_ILL_INPUT);
  }

  /* Retrieve the LS type */
  LSType = SUNLinSolGetType(LS);

  /* Check for compatible LS type, matrix and "atimes" support */
  if ((LSType == SUNLINEARSOLVER_ITERATIVE) && (LS->ops->setatimes == NULL)) {
    KINProcessError(kin_mem, KINLS_ILL_INPUT, "KINLS", "KINSetLinearSolver",
                    "Incompatible inputs: iterative LS must support ATimes routine");
    return(KINLS_ILL_INPUT);
  }
  if ((LSType == SUNLINEARSOLVER_DIRECT) && (A == NULL)) {
    KINProcessError(kin_mem, KINLS_ILL_INPUT, "KINLS", "KINSetLinearSolver",
                    "Incompatible inputs: direct LS requires non-NULL matrix");
    return(KINLS_ILL_INPUT);
  }
  if ((LSType == SUNLINEARSOLVER_MATRIX_ITERATIVE) && (A == NULL)) {
    KINProcessError(kin_mem, KINLS_ILL_INPUT, "KINLS", "KINSetLinearSolver",
                    "Incompatible inputs: matrix-iterative LS requires non-NULL matrix");
    return(KINLS_ILL_INPUT);
  }

  /* free any existing system solver attached to KIN */
  if (kin_mem->kin_lfree) kin_mem->kin_lfree(kin_mem);

  /* Determine if this is an iterative linear solver */
  kin_mem->kin_inexact_ls = ( (LSType == SUNLINEARSOLVER_ITERATIVE) ||
                              (LSType == SUNLINEARSOLVER_MATRIX_ITERATIVE) );

  /* Set four main system linear solver function fields in kin_mem */
  kin_mem->kin_linit  = kinLsInitialize;
  kin_mem->kin_lsetup = kinLsSetup;
  kin_mem->kin_lsolve = kinLsSolve;
  kin_mem->kin_lfree  = kinLsFree;

  /* Get memory for KINLsMemRec */
  kinls_mem = NULL;
  kinls_mem = (KINLsMem) malloc(sizeof(struct KINLsMemRec));
  if (kinls_mem == NULL) {
    KINProcessError(kin_mem, KINLS_MEM_FAIL, "KINLS",
                    "KINSetLinearSolver", MSG_LS_MEM_FAIL);
    return(KINLS_MEM_FAIL);
  }
  memset(kinls_mem, 0, sizeof(struct KINLsMemRec));

  /* set SUNLinearSolver pointer */
  kinls_mem->LS = LS;

  /* Set defaults for Jacobian-related fields */
  if (A != NULL) {
    kinls_mem->jacDQ  = SUNTRUE;
    kinls_mem->jac    = kinLsDQJac;
    kinls_mem->J_data = kin_mem;
  } else {
    kinls_mem->jacDQ  = SUNFALSE;
    kinls_mem->jac    = NULL;
    kinls_mem->J_data = NULL;
  }
  kinls_mem->jtimesDQ = SUNTRUE;
  kinls_mem->jtimes   = kinLsDQJtimes;
  kinls_mem->jt_data  = kin_mem;

  /* Set defaults for preconditioner-related fields */
  kinls_mem->pset   = NULL;
  kinls_mem->psolve = NULL;
  kinls_mem->pfree  = NULL;
  kinls_mem->pdata  = kin_mem->kin_user_data;

  /* Initialize counters */
  kinLsInitializeCounters(kinls_mem);

  /* Set default values for the rest of the LS parameters */
  kinls_mem->last_flag = KINLS_SUCCESS;

  /* If LS supports ATimes, attach KINLs routine */
  if (LS->ops->setatimes) {
    retval = SUNLinSolSetATimes(LS, kin_mem, kinLsATimes);
    if (retval != SUNLS_SUCCESS) {
      KINProcessError(kin_mem, KINLS_SUNLS_FAIL, "KINLS",
                      "KINSetLinearSolver",
                      "Error in calling SUNLinSolSetATimes");
      free(kinls_mem); kinls_mem = NULL;
      return(KINLS_SUNLS_FAIL);
    }
  }

  /* If LS supports preconditioning, initialize pset/psol to NULL */
  if (LS->ops->setpreconditioner) {
    retval = SUNLinSolSetPreconditioner(LS, kin_mem, NULL, NULL);
    if (retval != SUNLS_SUCCESS) {
      KINProcessError(kin_mem, KINLS_SUNLS_FAIL, "KINLS",
                      "KINSetLinearSolver",
                      "Error in calling SUNLinSolSetPreconditioner");
      free(kinls_mem); kinls_mem = NULL;
      return(KINLS_SUNLS_FAIL);
    }
  }

  /* initialize tolerance scaling factor */
  kinls_mem->tol_fac = -ONE;

  /* set SUNMatrix pointer (can be NULL) */
  kinls_mem->J = A;

  /* Attach linear solver memory to integrator memory */
  kin_mem->kin_lmem = kinls_mem;

  return(KINLS_SUCCESS);
}